

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

iterator __thiscall
cs::tree_type<cs::token_base_*>::erase_right(tree_type<cs::token_base_*> *this,iterator it)

{
  error *this_00;
  string local_38;
  
  if (it.mData != (tree_node *)0x0) {
    destroy((it.mData)->right);
    (it.mData)->right = (tree_node *)0x0;
    return (iterator)it.mData;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000E","");
  cov::error::error(this_00,&local_38);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

bool usable() const noexcept
			{
				return this->mData != nullptr;
			}